

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O0

void __thiscall capnp::anon_unknown_79::Input::advance(Input *this,size_t numBytes)

{
  bool bVar1;
  char *pcVar2;
  char *end;
  ArrayPtr<const_char> AVar3;
  char *local_78;
  size_t local_70;
  Fault local_58;
  Fault f;
  unsigned_long *local_48;
  undefined1 local_40 [8];
  DebugComparison<unsigned_long_&,_unsigned_long> _kjCondition;
  size_t numBytes_local;
  Input *this_local;
  
  _kjCondition._32_8_ = numBytes;
  local_48 = (unsigned_long *)
             kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                        (unsigned_long *)&_kjCondition.result);
  f.exception = (Exception *)kj::ArrayPtr<const_char>::size(&this->wrapped);
  kj::_::DebugExpression<unsigned_long&>::operator<=
            ((DebugComparison<unsigned_long_&,_unsigned_long> *)local_40,
             (DebugExpression<unsigned_long&> *)&local_48,(unsigned_long *)&f);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_40);
  if (!bVar1) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,unsigned_long>&,char_const(&)[31]>
              (&local_58,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compat/json.c++"
               ,0x231,FAILED,"numBytes <= wrapped.size()",
               "_kjCondition,\"JSON message ends prematurely.\"",
               (DebugComparison<unsigned_long_&,_unsigned_long> *)local_40,
               (char (*) [31])"JSON message ends prematurely.");
    kj::_::Debug::Fault::fatal(&local_58);
  }
  pcVar2 = kj::ArrayPtr<const_char>::begin(&this->wrapped);
  pcVar2 = pcVar2 + _kjCondition._32_8_;
  end = kj::ArrayPtr<const_char>::end(&this->wrapped);
  AVar3 = kj::arrayPtr<char_const>(pcVar2,end);
  local_78 = AVar3.ptr;
  (this->wrapped).ptr = local_78;
  local_70 = AVar3.size_;
  (this->wrapped).size_ = local_70;
  return;
}

Assistant:

void advance(size_t numBytes = 1) {
    KJ_REQUIRE(numBytes <= wrapped.size(), "JSON message ends prematurely.");
    wrapped = kj::arrayPtr(wrapped.begin() + numBytes, wrapped.end());
  }